

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pztrigraph.cpp
# Opt level: O3

int64_t __thiscall TPZGraphElT::EqNum(TPZGraphElT *this,TPZVec<int> *co)

{
  long lVar1;
  int *piVar2;
  undefined1 auVar3 [16];
  int64_t iVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  TPZGraphNode *this_00;
  long lVar9;
  int iVar24;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar17;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  uint uVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int orient [3];
  uint local_1c [3];
  
  iVar17 = ((this->super_TPZGraphEl).fGraphMesh)->fResolution;
  lVar7 = 0;
  do {
    lVar1 = lVar7 + 1;
    lVar9 = 0;
    if (lVar7 != 2) {
      lVar9 = lVar1;
    }
    local_1c[lVar7] =
         (uint)(this->fConnects[lVar9]->fSequenceNumber < this->fConnects[lVar7]->fSequenceNumber);
    lVar7 = lVar1;
  } while (lVar1 != 3);
  iVar8 = 1 << ((byte)iVar17 & 0x1f);
  piVar2 = co->fStore;
  iVar17 = *piVar2;
  if ((iVar17 == 0) && (piVar2[1] == 0)) {
    this_00 = this->fConnects[0];
  }
  else if ((iVar17 == iVar8) && (piVar2[1] == 0)) {
    this_00 = this->fConnects[1];
  }
  else {
    iVar19 = piVar2[1];
    if ((iVar17 != 0) || (iVar19 != iVar8)) {
      if (iVar19 == 0) {
        iVar4 = TPZGraphNode::FirstPoint(this->fConnects[3]);
        iVar4 = iVar4 + *co->fStore + (long)(iVar8 + *co->fStore * -2) * (long)(int)local_1c[0] + -1
        ;
      }
      else {
        if (iVar19 + iVar17 == iVar8) {
          iVar4 = TPZGraphNode::FirstPoint(this->fConnects[4]);
          uVar6 = *co->fStore;
          lVar7 = (int)(~uVar6 + iVar8) + iVar4;
        }
        else {
          if (iVar17 != 0) {
            iVar4 = TPZGraphNode::FirstPoint(this->fConnects[6]);
            uVar5 = (iVar4 + co->fStore[1]) - 1;
            uVar6 = *co->fStore;
            if ((long)(int)uVar6 < 2) {
              return uVar5;
            }
            lVar7 = (long)(int)uVar6 + -2;
            auVar10._8_8_ = 0;
            auVar10._0_8_ = uVar5;
            auVar12._8_4_ = (int)lVar7;
            auVar12._0_8_ = lVar7;
            auVar12._12_4_ = (int)((ulong)lVar7 >> 0x20);
            uVar18 = 1;
            uVar20 = 2;
            lVar7 = 2;
            do {
              auVar11 = auVar10;
              iVar24 = (uVar18 ^ 0xffffffff) + iVar8;
              auVar15._4_4_ = (uVar20 ^ 0xffffffff) + iVar8;
              auVar15._8_4_ = auVar15._4_4_;
              auVar15._12_4_ = -(uint)(auVar15._4_4_ < 0);
              auVar10._0_8_ = CONCAT44(-(uint)(iVar24 < 0),iVar24) + auVar11._0_8_;
              auVar10._8_8_ = auVar15._8_8_ + auVar11._8_8_;
              uVar18 = uVar18 + 2;
              uVar20 = uVar20 + 2;
              lVar1 = (ulong)(uVar6 & 0x7ffffffe) + lVar7;
              lVar7 = lVar7 + -2;
            } while (lVar1 != 4);
            lVar7 = -lVar7;
            auVar14._8_4_ = (int)lVar7;
            auVar14._0_8_ = lVar7;
            auVar14._12_4_ = (int)((ulong)lVar7 >> 0x20);
            auVar12 = auVar12 ^ _DAT_014d28c0;
            auVar15 = (auVar14 | _DAT_014d28b0) ^ _DAT_014d28c0;
            iVar19 = -(uint)(auVar12._0_4_ < auVar15._0_4_);
            iVar21 = -(uint)(auVar12._4_4_ < auVar15._4_4_);
            iVar22 = -(uint)(auVar12._8_4_ < auVar15._8_4_);
            iVar23 = -(uint)(auVar12._12_4_ < auVar15._12_4_);
            iVar17 = -(uint)(auVar15._4_4_ == auVar12._4_4_);
            iVar8 = -(uint)(auVar15._12_4_ == auVar12._12_4_);
            auVar13._4_4_ = iVar17;
            auVar13._0_4_ = iVar17;
            auVar13._8_4_ = iVar8;
            auVar13._12_4_ = iVar8;
            auVar3._4_4_ = iVar19;
            auVar3._0_4_ = iVar19;
            auVar3._8_4_ = iVar22;
            auVar3._12_4_ = iVar22;
            auVar16._4_4_ = iVar21;
            auVar16._0_4_ = iVar21;
            auVar16._8_4_ = iVar23;
            auVar16._12_4_ = iVar23;
            auVar16 = auVar16 | auVar13 & auVar3;
            auVar10 = ~auVar16 & auVar10 | auVar11 & auVar16;
            return auVar10._8_8_ + auVar10._0_8_;
          }
          iVar4 = TPZGraphNode::FirstPoint(this->fConnects[5]);
          uVar6 = co->fStore[1];
          lVar7 = (int)(~uVar6 + iVar8) + iVar4;
          local_1c[1] = local_1c[2];
        }
        iVar4 = (long)(int)(uVar6 * 2 - iVar8) * (long)(int)local_1c[1] + lVar7;
      }
      return iVar4;
    }
    this_00 = this->fConnects[2];
  }
  iVar4 = TPZGraphNode::FirstPoint(this_00);
  return iVar4;
}

Assistant:

int64_t TPZGraphElT::EqNum(TPZVec<int> &co){
	int orient[3];
	int loc;
	int res = fGraphMesh->Res();
	int imax = (1<<res);
	for(int is=0;is<3;is++) {
		orient[is] = (fConnects[is]->SequenceNumber() > fConnects[(is+1)%3]->SequenceNumber()) ? 1 : 0;
	}
	if(co[0]==0 && co[1]==0) return fConnects[0]->FirstPoint();
	if(co[0]==imax && co[1]==0) return fConnects[1]->FirstPoint();
	if(co[0]==0 && co[1]==imax) return fConnects[2]->FirstPoint();
	
	if(co[1]==0) loc = 0;
	else if(co[0]+co[1]==imax) loc=1;
	else if(co[0]==0) loc=2;
	else loc=3;
	int64_t first = fConnects[3+loc]->FirstPoint();
	int64_t neq;
	switch(loc) {
		case 0:
			neq = first + (co[0]-1) + orient[loc]*(imax-1-co[0]-co[0]+1);
			break;
		case 1:
			neq = first + (imax-1-co[0]) + orient[loc]*(co[0]-1-imax+1+co[0]);
			break;
		case 2:
			neq = first + (imax-1-co[1]) + orient[loc]*(co[1]-1-imax+1+co[1]);
			break;
		case 3:
		{
			neq = first + (co[1]-1);
			for(int run=1;run<co[0];run++) neq += imax-run-1;
			break;
		}
		default:
			neq = 0;
			break;
	}
	return neq;
}